

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

undefined8 to_hex<unsigned_short>(unsigned_short obj,size_t width)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  int in_EDX;
  undefined6 in_register_0000003a;
  stringstream local_1a8 [8];
  stringstream ss;
  undefined1 local_198 [376];
  int local_20;
  size_t width_local;
  undefined8 uStack_10;
  unsigned_short obj_local;
  
  width_local._6_2_ = (ushort)width;
  uStack_10 = CONCAT62(in_register_0000003a,obj);
  local_20 = in_EDX;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = (ostream *)std::ostream::operator<<(local_198,std::hex);
  _Var2 = std::setw(local_20);
  poVar3 = std::operator<<(poVar3,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  std::ostream::operator<<(poVar3,(ulong)width_local._6_2_);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return CONCAT62(in_register_0000003a,obj);
}

Assistant:

std::string to_hex(T obj, size_t width = sizeof(T) * 2)
{
    std::stringstream ss;
    ss << std::hex << std::setw(width) << std::setfill('0') << (size_t)obj;
    return ss.str();
}